

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

int boost::detail::function::function_obj_invoker0<boost::detail::forward,_int>::invoke
              (function_buffer *function_obj_ptr)

{
  int iVar1;
  forward *f;
  
  iVar1 = forward::operator()((forward *)0x294bfd);
  return iVar1;
}

Assistant:

static R invoke(function_buffer& function_obj_ptr BOOST_FUNCTION_COMMA
                        BOOST_FUNCTION_PARMS)

        {
          FunctionObj* f;
          if (function_allows_small_object_optimization<FunctionObj>::value)
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.data);
          else
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.members.obj_ptr);
          return (*f)(BOOST_FUNCTION_ARGS);
        }